

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int32 bio_writehdr(FILE *fp,...)

{
  char in_AL;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  undefined8 in_RCX;
  void **ppvVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uint32 b;
  void **local_e0;
  undefined4 local_cc;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  fwrite("s3\n",3,1,(FILE *)fp);
  uVar1 = 8;
  local_e0 = &args[0].overflow_arg_area;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if (uVar2 < 0x29) {
      ppvVar4 = (void **)((long)local_c8 + uVar2);
      uVar1 = uVar1 + 8;
      uVar2 = (ulong)uVar1;
    }
    else {
      ppvVar4 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if (*ppvVar4 == (void *)0x0) {
      fwrite("endhdr\n",7,1,(FILE *)fp);
      fflush((FILE *)fp);
      local_cc = 0x11223344;
      sVar3 = fwrite(&local_cc,4,1,(FILE *)fp);
      if (sVar3 != 1) {
        return -1;
      }
      fflush((FILE *)fp);
      return 0;
    }
    if ((uint)uVar2 < 0x29) {
      uVar1 = (uint)uVar2 + 8;
      ppvVar4 = (void **)((long)local_c8 + uVar2);
    }
    else {
      ppvVar4 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if (*ppvVar4 == (void *)0x0) break;
    fprintf((FILE *)fp,"%s %s\n");
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
          ,0xa6,"Wrong number of arguments\n");
  return -1;
}

Assistant:

int32
bio_writehdr(FILE *fp, ...)
{
    char const *key;
    va_list args;
    uint32 b;

    fprintf(fp, "s3\n");
    va_start(args, fp);
    while ((key = va_arg(args, char const *)) != NULL) {
        char const *val = va_arg(args, char const *);
        if (val == NULL) {
            E_ERROR("Wrong number of arguments\n");
            va_end(args);
            return -1;
        }
        fprintf(fp, "%s %s\n", key, val);
    }
    va_end(args);

    fprintf(fp, "endhdr\n");
    fflush(fp);

    b = (uint32) BYTE_ORDER_MAGIC;
    if (fwrite(&b, sizeof(uint32), 1, fp) != 1)
        return -1;
    fflush(fp);

    return 0;
}